

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<false,duckdb::interval_t,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  int iVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  unsigned_long *puVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  const_reference pvVar12;
  idx_t iVar13;
  idx_t iVar14;
  idx_t iVar15;
  uint uVar16;
  idx_t iVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  bool bVar23;
  uchar **rhs_locations;
  interval_t *lhs_data;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar3 = (lhs_format->unified).sel;
    pdVar2 = (lhs_format->unified).data;
    pdVar4 = rhs_row_locations->data;
    pvVar12 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar5 = *pvVar12;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar3->sel_vector;
      iVar13 = 0;
      iVar15 = 0;
      do {
        iVar14 = iVar15;
        if (psVar6 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar6[iVar15];
        }
        iVar17 = iVar14;
        if (psVar7 != (sel_t *)0x0) {
          iVar17 = (idx_t)psVar7[iVar14];
        }
        lVar9 = *(long *)(pdVar4 + iVar14 * 8);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(lVar9 + (col_idx >> 3))) != 0) {
          lVar10 = *(long *)(lVar9 + 8 + vVar5);
          uVar11 = *(undefined8 *)(lVar9 + vVar5);
          lVar19 = iVar17 * 0x10;
          iVar21 = (int)((ulong)uVar11 >> 0x20);
          iVar1 = *(int *)(pdVar2 + lVar19 + 4);
          lVar9 = *(long *)(pdVar2 + lVar19 + 8);
          iVar20 = (int)uVar11;
          if (((*(int *)(pdVar2 + lVar19) != iVar20) || (iVar1 != iVar21)) ||
             (iVar21 = iVar1, lVar9 != lVar10)) {
            lVar18 = (long)iVar1 + lVar9 / 86400000000;
            lVar22 = (long)iVar21 + lVar10 / 86400000000;
            if ((((long)*(int *)(pdVar2 + lVar19) + lVar18 / 0x1e != (long)iVar20 + lVar22 / 0x1e)
                || (lVar18 % 0x1e != lVar22 % 0x1e)) ||
               (lVar9 % 86400000000 != lVar10 % 86400000000)) goto LAB_015ca45d;
          }
          psVar6[iVar13] = (sel_t)iVar14;
          iVar13 = iVar13 + 1;
        }
LAB_015ca45d:
        iVar15 = iVar15 + 1;
        if (count == iVar15) {
          return iVar13;
        }
      } while( true );
    }
  }
  else {
    pdVar2 = rhs_row_locations->data;
    pSVar3 = (lhs_format->unified).sel;
    pdVar4 = (lhs_format->unified).data;
    pvVar12 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar5 = *pvVar12;
      psVar6 = sel->sel_vector;
      psVar7 = pSVar3->sel_vector;
      puVar8 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      iVar13 = 0;
      iVar15 = 0;
      do {
        iVar14 = iVar15;
        if (psVar6 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar6[iVar15];
        }
        iVar17 = iVar14;
        if (psVar7 != (sel_t *)0x0) {
          iVar17 = (idx_t)psVar7[iVar14];
        }
        if (puVar8 == (unsigned_long *)0x0) {
          bVar23 = false;
        }
        else {
          bVar23 = (puVar8[iVar17 >> 6] >> (iVar17 & 0x3f) & 1) == 0;
        }
        lVar9 = *(long *)(pdVar2 + iVar14 * 8);
        uVar16 = (uint)*(byte *)(lVar9 + (col_idx >> 3)) & 1 << ((byte)col_idx & 7);
        if ((bVar23 == false) && (uVar16 != 0)) {
          lVar10 = *(long *)(lVar9 + 8 + vVar5);
          uVar11 = *(undefined8 *)(lVar9 + vVar5);
          lVar19 = iVar17 * 0x10;
          iVar21 = (int)((ulong)uVar11 >> 0x20);
          iVar1 = *(int *)(pdVar4 + lVar19 + 4);
          lVar9 = *(long *)(pdVar4 + lVar19 + 8);
          iVar20 = (int)uVar11;
          if (((*(int *)(pdVar4 + lVar19) != iVar20) || (iVar1 != iVar21)) ||
             (iVar21 = iVar1, lVar9 != lVar10)) {
            lVar18 = (long)iVar1 + lVar9 / 86400000000;
            lVar22 = (long)iVar21 + lVar10 / 86400000000;
            if ((((long)*(int *)(pdVar4 + lVar19) + lVar18 / 0x1e != (long)iVar20 + lVar22 / 0x1e)
                || (lVar18 % 0x1e != lVar22 % 0x1e)) ||
               (lVar9 % 86400000000 != lVar10 % 86400000000)) goto LAB_015ca281;
          }
LAB_015ca25f:
          psVar6[iVar13] = (sel_t)iVar14;
          iVar13 = iVar13 + 1;
        }
        else if (bVar23 == (uVar16 == 0)) goto LAB_015ca25f;
LAB_015ca281:
        iVar15 = iVar15 + 1;
        if (count == iVar15) {
          return iVar13;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}